

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O1

void __thiscall AsyncLog::ThreadFunc(AsyncLog *this)

{
  LogFile *pLVar1;
  pointer puVar2;
  BufferPtr *__args;
  vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
  *this_00;
  FixedBuffer<4096UL> *pFVar3;
  FixedBuffer<4096UL> *pFVar4;
  pointer puVar5;
  ulong uVar6;
  pointer __old_p;
  FixedBuffer<4096UL> *pFVar7;
  pointer puVar8;
  LockGuard lock;
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  vecWriteBuffers;
  LockGuard local_60;
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  local_58;
  BufferPtr *local_40;
  vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
  *local_38;
  
  pFVar3 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  pFVar3->m_pos = 0;
  pFVar4 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  pFVar4->m_pos = 0;
  local_58.
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::reserve(&local_58,0x10);
  LockGuard::LockGuard
            (&local_60,
             (this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>._M_t.
             super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
             super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  Condition::Notify((this->m_mainThreadRunCond)._M_t.
                    super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
                    super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
                    super__Head_base<0UL,_Condition_*,_false>._M_head_impl);
  LockGuard::~LockGuard(&local_60);
  local_38 = (vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
              *)&this->m_buffers;
  local_40 = &this->m_curBuff;
  while (this_00 = local_38, __args = local_40, this->m_bRunning == true) {
    LockGuard::LockGuard
              (&local_60,
               (this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>._M_t.
               super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
               super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
    if ((this->m_buffers).
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_buffers).
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Condition::WaitForSeconds
                ((this->m_subThreadFlushCond)._M_t.
                 super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
                 super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
                 super__Head_base<0UL,_Condition_*,_false>._M_head_impl,3.0);
    }
    std::
    vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
    ::emplace_back<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>
              (this_00,__args);
    pFVar7 = (__args->_M_t).
             super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
             _M_t.
             super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
             .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
    (__args->_M_t).
    super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
    super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
    super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = pFVar3;
    if (pFVar7 != (FixedBuffer<4096UL> *)0x0) {
      operator_delete(pFVar7);
    }
    ((this->m_curBuff)._M_t.
     super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
     super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
     super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl)->m_pos = 0;
    pFVar7 = pFVar4;
    if ((this->m_nextBuff)._M_t.
        super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
        super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
        super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl ==
        (FixedBuffer<4096UL> *)0x0) {
      (this->m_nextBuff)._M_t.
      super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
      super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
      super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = pFVar4;
      pFVar4->m_pos = 0;
      pFVar7 = (FixedBuffer<4096UL> *)0x0;
    }
    puVar2 = (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar5 = (this->m_buffers).
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_buffers).
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_buffers).
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_buffers).
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar2;
    local_58.
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar8;
    local_58.
    super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar5;
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::clear((vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             *)this_00);
    LockGuard::~LockGuard(&local_60);
    if (local_58.
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        pLVar1 = (this->m_logFilePtr)._M_t.
                 super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
                 super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
                 super__Head_base<0UL,_LogFile_*,_false>._M_head_impl;
        pFVar3 = local_58.
                 super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                 super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                 .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
        pFVar3->m_buff[pFVar3->m_pos] = '\0';
        LogFile::Append(pLVar1,pFVar3->m_buff,
                        (local_58.
                         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                         super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                         .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl)->m_pos);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)local_58.
                                     super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_58.
                                     super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pFVar3 = ((local_58.
               super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
             _M_t.
             super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
             .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
    ((local_58.
      super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
    super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
    super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = (FixedBuffer<4096UL> *)0x0;
    pFVar4 = pFVar7;
    if (8 < (ulong)((long)local_58.
                          super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.
                         super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      pFVar4 = local_58.
               super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
               super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
               .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
      local_58.
      super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
      super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
      super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
      super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = (FixedBuffer<4096UL> *)0x0;
      if (pFVar7 != (FixedBuffer<4096UL> *)0x0) {
        operator_delete(pFVar7);
      }
    }
    puVar2 = local_58.
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar5 = local_58.
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = local_58.
             super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_58.
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pFVar7 = (puVar8->_M_t).
                 super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
                 .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
        if (pFVar7 != (FixedBuffer<4096UL> *)0x0) {
          operator_delete(pFVar7);
        }
        (puVar8->_M_t).
        super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
        super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
        super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl =
             (FixedBuffer<4096UL> *)0x0;
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar2);
      local_58.
      super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar5;
    }
    LogFile::Flush((this->m_logFilePtr)._M_t.
                   super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
                   super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
                   super__Head_base<0UL,_LogFile_*,_false>._M_head_impl);
  }
  LockGuard::LockGuard
            (&local_60,
             (this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>._M_t.
             super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
             super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  std::
  vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
  ::emplace_back<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>
            (this_00,__args);
  puVar5 = (this->m_buffers).
           super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_buffers).
      super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar6 = 0;
    do {
      pLVar1 = (this->m_logFilePtr)._M_t.
               super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
               super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
               super__Head_base<0UL,_LogFile_*,_false>._M_head_impl;
      pFVar7 = puVar5[uVar6]._M_t.
               super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
               .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
      pFVar7->m_buff[pFVar7->m_pos] = '\0';
      LogFile::Append(pLVar1,pFVar7->m_buff,
                      *(size_t *)
                       ((long)(this->m_buffers).
                              super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                              super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
                              ._M_t + 0x1000));
      uVar6 = uVar6 + 1;
      puVar5 = (this->m_buffers).
               super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->m_buffers).
                                   super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3));
  }
  LogFile::Flush((this->m_logFilePtr)._M_t.
                 super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
                 super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
                 super__Head_base<0UL,_LogFile_*,_false>._M_head_impl);
  LockGuard::~LockGuard(&local_60);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::~vector(&local_58);
  if (pFVar4 != (FixedBuffer<4096UL> *)0x0) {
    operator_delete(pFVar4);
  }
  if (pFVar3 != (FixedBuffer<4096UL> *)0x0) {
    operator_delete(pFVar3);
  }
  return;
}

Assistant:

void AsyncLog::ThreadFunc()
{
	BufferPtr firstBuffer(new Buffer);
	BufferPtr secondBuffer(new Buffer);
	std::vector<BufferPtr> vecWriteBuffers;
	vecWriteBuffers.reserve(16);
	{
		LockGuard lock(*m_mutex);
		m_mainThreadRunCond->Notify();
	}
	//std::cout << "Sub thread, " << __LINE__ << " Running " << std::endl;
	while(m_bRunning)
	{
		{
			LockGuard lock(*m_mutex);
			if (m_buffers.empty())
			{
				//std::cout << "Sub thread, wait for Condition, " << __LINE__ << std::endl;
				m_subThreadFlushCond->WaitForSeconds(3);
				//m_subThreadFlushCond.Wait();
			}
			//std::cout << "Sub thread, " << __LINE__ << " Buffer size, " <<m_buffers.size() << std::endl;
			
			m_buffers.push_back(std::move(m_curBuff));
			m_curBuff = std::move(firstBuffer);
			m_curBuff->Reset();
			if (!m_nextBuff)
			{
				m_nextBuff = std::move(secondBuffer);
				m_nextBuff->Reset();
			}
			
			m_buffers.swap(vecWriteBuffers);
			m_buffers.clear();
		}
		
		for (size_t i = 0; i < vecWriteBuffers.size(); ++i)
		{
			m_logFilePtr->Append(vecWriteBuffers[i]->Data(), vecWriteBuffers[i]->Size());
		}
		
		firstBuffer = std::move(vecWriteBuffers[0]);
		if (2 <= vecWriteBuffers.size())
		{
			secondBuffer = std::move(vecWriteBuffers[1]);
		}
		vecWriteBuffers.clear();
		m_logFilePtr->Flush();
	}

	// push data in buffer to the log file
	LockGuard lock(*m_mutex);
	m_buffers.push_back(std::move(m_curBuff));
	for (size_t i = 0; i < m_buffers.size(); ++i)
	{
		m_logFilePtr->Append(m_buffers[i]->Data(), m_buffers[i]->Size());
	}
	m_logFilePtr->Flush();
}